

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-create-socket-early.c
# Opt level: O2

int run_test_udp_create_early_bad_domain(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_udp_t client;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_udp_init_ex(uVar2,&client,0x2f);
  eval_a = (int64_t)iVar1;
  eval_b = -0x16;
  if (eval_a == -0x16) {
    uVar2 = uv_default_loop();
    iVar1 = uv_udp_init_ex(uVar2,&client,0x400);
    eval_a = (int64_t)iVar1;
    eval_b = -0x16;
    if (eval_a == -0x16) {
      uVar2 = uv_default_loop();
      uv_run(uVar2,0);
      loop = (uv_loop_t *)uv_default_loop();
      close_loop(loop);
      eval_a = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      eval_b = (int64_t)iVar1;
      if (eval_b == 0) {
        uv_library_shutdown();
        return 0;
      }
      pcVar4 = "uv_loop_close(uv_default_loop())";
      pcVar3 = "0";
      uVar2 = 0x89;
    }
    else {
      pcVar4 = "UV_EINVAL";
      pcVar3 = "r";
      uVar2 = 0x85;
    }
  }
  else {
    pcVar4 = "UV_EINVAL";
    pcVar3 = "r";
    uVar2 = 0x82;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-create-socket-early.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(udp_create_early_bad_domain) {
  uv_udp_t client;
  int r;

  r = uv_udp_init_ex(uv_default_loop(), &client, 47);
  ASSERT_EQ(r, UV_EINVAL);

  r = uv_udp_init_ex(uv_default_loop(), &client, 1024);
  ASSERT_EQ(r, UV_EINVAL);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}